

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

bool __thiscall Memory::HeapInfo::HasZeroQueuedPages(HeapInfo *this)

{
  byte local_11;
  HeapInfo *pHStack_10;
  bool hasZeroQueuedPage;
  HeapInfo *this_local;
  
  local_11 = 0;
  pHStack_10 = this;
  ForEachNonLeafPageAllocator<Memory::HeapInfo::HasZeroQueuedPages()::__0>
            (this,(anon_class_8_1_8889d644)&local_11);
  return (bool)(local_11 & 1);
}

Assistant:

bool HeapInfo::HasZeroQueuedPages()
{
    bool hasZeroQueuedPage = false;
    ForEachNonLeafPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        hasZeroQueuedPage = hasZeroQueuedPage || pageAlloc->HasZeroQueuedPages();
    });
    return hasZeroQueuedPage;
}